

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

bool local::test_uintwide_t_0000064_by_0000064_4_by_4(void)

{
  bool bVar1;
  ostream *poVar2;
  test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<64U,_unsigned_short,_void>
  test_uintwide_t_n_binary_ops_template_instance;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "running: test_uintwide_t_0000064_by_0000064_4_by_4");
  std::endl<char,std::char_traits<char>>(poVar2);
  test_uintwide_t_n_binary_ops_template_instance.super_test_uintwide_t_n_binary_ops_base.
  super_test_uintwide_t_n_base.number_of_cases = 0x8000;
  test_uintwide_t_n_binary_ops_template_instance.super_test_uintwide_t_n_binary_ops_base.
  super_test_uintwide_t_n_base._vptr_test_uintwide_t_n_base =
       (_func_int **)&PTR__test_uintwide_t_n_binary_ops_mul_div_4_by_4_template_00217178;
  test_uintwide_t_n_binary_ops_template_instance.a_local.
  super__Vector_base<math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.a_local.
  super__Vector_base<math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.a_local.
  super__Vector_base<math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.b_local.
  super__Vector_base<math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.b_local.
  super__Vector_base<math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.b_local.
  super__Vector_base<math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.a_cntrl.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.a_cntrl.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.a_cntrl.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.b_cntrl.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.b_cntrl.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.b_cntrl.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<64U,_unsigned_short,_void>::do_test
                    (&test_uintwide_t_n_binary_ops_template_instance,4);
  test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<64U,_unsigned_short,_void>::
  ~test_uintwide_t_n_binary_ops_mul_div_4_by_4_template
            (&test_uintwide_t_n_binary_ops_template_instance);
  return bVar1;
}

Assistant:

auto test_uintwide_t_0000064_by_0000064_4_by_4() -> bool
{
  std::cout << "running: test_uintwide_t_0000064_by_0000064_4_by_4" << std::endl;
  test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<64U, std::uint16_t> test_uintwide_t_n_binary_ops_template_instance(test_uintwide_t_n_binary_ops_4_by_4_cases); // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
  const auto result_is_ok =
    test_uintwide_t_n_binary_ops_template_instance.do_test(test_uintwide_t_n_binary_ops_rounds);
  return result_is_ok;
}